

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O3

int mask_contains(uint32_t *a,uint32_t *b,int size)

{
  ulong uVar1;
  
  if (0 < size) {
    uVar1 = 0;
    do {
      if ((b[uVar1] & ~a[uVar1]) != 0) {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while (size + 0x1fU >> 5 != uVar1);
  }
  return 1;
}

Assistant:

int mask_contains(uint32_t *a, uint32_t *b, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	for (i = 0; i < rsize; i++)
		if ((a[i] & b[i]) != b[i]) {
			return 0;
		}
	return 1;
}